

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Minefield_State_PDU::Decode
          (Minefield_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pPVar1;
  pointer pPVar2;
  pointer pEVar3;
  pointer pEVar4;
  KUINT16 *pKVar5;
  KUINT16 KVar6;
  KException *this_00;
  int iVar7;
  undefined7 in_register_00000011;
  ushort uVar8;
  byte bVar9;
  pointer pPVar10;
  pointer pEVar11;
  KString local_58;
  KUINT16 *local_38;
  
  KVar6 = KDataStream::GetBufferSize(stream);
  iVar7 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar7 = 0;
  }
  if (iVar7 + (uint)KVar6 < 0x48) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Decode","");
    KException::KException(this_00,&local_58,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pPVar1 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar10 = pPVar1;
  if (pPVar2 != pPVar1) {
    do {
      (**(pPVar10->super_DataTypeBase)._vptr_DataTypeBase)(pPVar10);
      pPVar10 = pPVar10 + 1;
    } while (pPVar10 != pPVar2);
    (this->m_vPoints).
    super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
    ._M_impl.super__Vector_impl_data._M_finish = pPVar1;
  }
  pEVar3 = (this->m_vMineTypes).
           super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (this->m_vMineTypes).
           super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar11 = pEVar3;
  if (pEVar4 != pEVar3) {
    do {
      (**(pEVar11->super_DataTypeBase)._vptr_DataTypeBase)(pEVar11);
      pEVar11 = pEVar11 + 1;
    } while (pEVar11 != pEVar4);
    (this->m_vMineTypes).
    super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>.
    _M_impl.super__Vector_impl_data._M_finish = pEVar3;
  }
  Minefield_Header::Decode(&this->super_Minefield_Header,stream,ignoreHeader);
  KDataStream::Read<unsigned_short>(stream,&(this->m_SeqNumUnion).m_ui16SeqNum);
  KDataStream::Read(stream,&this->m_ui8ForceID);
  KDataStream::Read(stream,&this->m_ui8NumPerimPoints);
  (*(this->m_MinefieldType).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_MinefieldType,stream)
  ;
  local_38 = &this->m_ui16NumMineTypes;
  KDataStream::Read<unsigned_short>(stream,local_38);
  (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Loc,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
  (*(this->m_App).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_App,stream);
  KDataStream::Read<unsigned_short>(stream,&(this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16);
  if (this->m_ui8NumPerimPoints != '\0') {
    bVar9 = 0;
    do {
      DATA_TYPE::PerimeterPointCoordinate::PerimeterPointCoordinate
                ((PerimeterPointCoordinate *)&local_58,stream);
      std::
      vector<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
      ::emplace_back<KDIS::DATA_TYPE::PerimeterPointCoordinate>
                (&this->m_vPoints,(PerimeterPointCoordinate *)&local_58);
      DATA_TYPE::PerimeterPointCoordinate::~PerimeterPointCoordinate
                ((PerimeterPointCoordinate *)&local_58);
      bVar9 = bVar9 + 1;
    } while (bVar9 < this->m_ui8NumPerimPoints);
  }
  pKVar5 = local_38;
  if (*local_38 != 0) {
    uVar8 = 0;
    do {
      DATA_TYPE::EntityType::EntityType((EntityType *)&local_58,stream);
      std::vector<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>::
      emplace_back<KDIS::DATA_TYPE::EntityType>(&this->m_vMineTypes,(EntityType *)&local_58);
      DATA_TYPE::DataTypeBase::~DataTypeBase((DataTypeBase *)&local_58);
      uVar8 = uVar8 + 1;
    } while (uVar8 < *pKVar5);
  }
  return;
}

Assistant:

void Minefield_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < MINEFIELD_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vPoints.clear();
    m_vMineTypes.clear();

    Minefield_Header::Decode( stream, ignoreHeader );

    stream >> m_SeqNumUnion.m_ui16SeqNum
           >> m_ui8ForceID
           >> m_ui8NumPerimPoints
           >> KDIS_STREAM m_MinefieldType
           >> m_ui16NumMineTypes
           >> KDIS_STREAM m_Loc
           >> KDIS_STREAM m_Ori
           >> KDIS_STREAM m_App
           >> m_ui16ProtocolModeUnion.m_ui16ProtocolMode16;

    for( KUINT8 i = 0; i < m_ui8NumPerimPoints; ++i )
    {
        m_vPoints.push_back( PerimeterPointCoordinate( stream ) );
    }

    for( KUINT16 j = 0; j < m_ui16NumMineTypes; ++j )
    {
        m_vMineTypes.push_back( EntityType( stream ) );
    }
}